

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

lws * lws_wsi_h2_adopt(lws *parent_wsi,lws *wsi)

{
  undefined1 *puVar1;
  uint *puVar2;
  lws_h2_netconn *plVar3;
  int iVar4;
  lws *plVar5;
  char *pcVar6;
  
  plVar5 = lws_get_network_wsi(parent_wsi);
  if ((((parent_wsi->h2).h2n)->our_set).s[3] < (parent_wsi->mux).child_count + 1) {
    wsi = (lws *)0x0;
    _lws_log(4,"reached concurrent stream limit\n");
  }
  else {
    *(ulong *)&wsi->field_0x46e =
         *(ulong *)&wsi->field_0x46e & 0xf7ffffffffffff7f | 0x800000000000000;
    puVar1 = &(wsi->h2).field_0x11;
    *puVar1 = *puVar1 | 0x10;
    pcVar6 = lws_wsi_tag(wsi);
    _lws_log(8,"%s: binding wsi %s to sid %d (next %d)\n","lws_wsi_h2_adopt",pcVar6,
             (ulong)(wsi->mux).my_sid,(ulong)((plVar5->h2).h2n)->highest_sid);
    lws_wsi_mux_insert(wsi,parent_wsi,(wsi->mux).my_sid);
    plVar3 = (plVar5->h2).h2n;
    (wsi->txc).tx_cr = (plVar3->peer_set).s[4];
    (wsi->txc).peer_tx_cr_est = (plVar3->our_set).s[4];
    lws_wsi_txc_describe(&wsi->txc,"lws_wsi_h2_adopt",(wsi->mux).my_sid);
    iVar4 = lws_ensure_user_space(wsi);
    if (iVar4 == 0) {
      lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      lws_callback_on_writable(wsi);
    }
    else {
      (parent_wsi->mux).child_list = (wsi->mux).sibling_list;
      puVar2 = &(parent_wsi->mux).child_count;
      *puVar2 = *puVar2 - 1;
      if (wsi->user_space != (void *)0x0) {
        lws_realloc(wsi->user_space,0,"free");
        wsi->user_space = (void *)0x0;
      }
      (*((wsi->a).protocol)->callback)(wsi,LWS_CALLBACK_WSI_DESTROY,(void *)0x0,(void *)0x0,0);
      lws_realloc(wsi,0,"lws_free");
      wsi = (lws *)0x0;
    }
  }
  return wsi;
}

Assistant:

struct lws *
lws_wsi_h2_adopt(struct lws *parent_wsi, struct lws *wsi)
{
	struct lws *nwsi = lws_get_network_wsi(parent_wsi);

	/* no more children allowed by parent */
	if (parent_wsi->mux.child_count + 1 >
	    parent_wsi->h2.h2n->our_set.s[H2SET_MAX_CONCURRENT_STREAMS]) {
		lwsl_notice("reached concurrent stream limit\n");
		return NULL;
	}

	/* sid is set just before issuing the headers, ensuring monoticity */

	wsi->seen_nonpseudoheader = 0;
#if defined(LWS_WITH_CLIENT)
	wsi->client_mux_substream = 1;
#endif
	wsi->h2.initialized = 1;

#if 0
	/* only assign sid at header send time when we know it */
	if (!wsi->mux.my_sid) {
		wsi->mux.my_sid = nwsi->h2.h2n->highest_sid;
		nwsi->h2.h2n->highest_sid += 2;
	}
#endif

	lwsl_info("%s: binding wsi %s to sid %d (next %d)\n", __func__,
		lws_wsi_tag(wsi), (int)wsi->mux.my_sid, (int)nwsi->h2.h2n->highest_sid);

	lws_wsi_mux_insert(wsi, parent_wsi, wsi->mux.my_sid);

	wsi->txc.tx_cr = (int32_t)nwsi->h2.h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
	wsi->txc.peer_tx_cr_est = (int32_t)
			nwsi->h2.h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];

	lws_wsi_txc_describe(&wsi->txc, __func__, wsi->mux.my_sid);

	if (lws_ensure_user_space(wsi))
		goto bail1;

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_H2_WAITING_TO_SEND_HEADERS,
			    &role_ops_h2);

	lws_callback_on_writable(wsi);

	return wsi;

bail1:
	/* undo the insert */
	parent_wsi->mux.child_list = wsi->mux.sibling_list;
	parent_wsi->mux.child_count--;

	if (wsi->user_space)
		lws_free_set_NULL(wsi->user_space);
	wsi->a.protocol->callback(wsi, LWS_CALLBACK_WSI_DESTROY, NULL, NULL, 0);
	lws_free(wsi);

	return NULL;
}